

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O2

int test(char *URL)

{
  setcase *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CURLUcode CVar5;
  CURLUcode CVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  char **ppcVar16;
  querycase *pqVar17;
  CURLUcode *pCVar18;
  long lVar19;
  bool bVar20;
  char *url_2;
  char *local_1f0;
  setcase *local_1e8;
  long local_1e0;
  char part [80];
  char *url;
  char local_88 [88];
  
  uVar7 = curl_url();
  iVar2 = curl_url_set(uVar7,0,"https://[fe80::20c:29ff:fe9c:409b%25eth0]/hello.html",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3b1,iVar2);
  }
  uVar13 = (uint)(iVar2 != 0);
  iVar2 = curl_url_get(uVar7,5,&url,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",url);
    curl_free(url);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3b8,iVar2);
    uVar13 = uVar13 + 1;
  }
  iVar2 = curl_url_set(uVar7,5,"[::1]",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3c3,iVar2);
    uVar13 = uVar13 + 1;
  }
  iVar2 = curl_url_get(uVar7,0,&url,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",url);
    curl_free(url);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3ca,iVar2);
    uVar13 = uVar13 + 1;
  }
  iVar2 = curl_url_set(uVar7,5,"example.com",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3d5,iVar2);
    uVar13 = uVar13 + 1;
  }
  iVar2 = curl_url_get(uVar7,0,&url,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",url);
    curl_free(url);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3dc,iVar2);
    uVar13 = uVar13 + 1;
  }
  iVar2 = curl_url_set(uVar7,5,"[fe80::20c:29ff:fe9c:409b%25eth0]",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,1000,iVar2);
    uVar13 = uVar13 + 1;
  }
  iVar2 = curl_url_get(uVar7,0,&url,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",url);
    curl_free(url);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3ef,iVar2);
    uVar13 = uVar13 + 1;
  }
  iVar2 = curl_url_get(uVar7,5,&url,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",url);
    curl_free(url);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3fa,iVar2);
    uVar13 = uVar13 + 1;
  }
  iVar2 = curl_url_get(uVar7,10,&url,0);
  if (iVar2 == 0) {
    curl_mprintf("we got %s\n",url);
    curl_free(url);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_ZONEID returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x405,iVar2);
    uVar13 = uVar13 + 1;
  }
  iVar2 = curl_url_set(uVar7,10,"clown",0);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_ZONEID returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x410,iVar2);
    uVar13 = 1;
  }
  iVar3 = curl_url_get(uVar7,0,&url,0);
  iVar2 = 6;
  if (iVar3 == 0) {
    curl_mprintf("we got %s\n",url);
    curl_free(url);
    curl_url_cleanup(uVar7);
    if (uVar13 == 0) {
      pqVar17 = append_list;
      iVar3 = 0;
      while( true ) {
        pcVar12 = pqVar17->in;
        iVar2 = 5;
        if ((pcVar12 == (char *)0x0) || (iVar3 != 0)) break;
        lVar8 = curl_url();
        if (lVar8 == 0) {
          return 5;
        }
        iVar2 = curl_url_set(lVar8,0,pcVar12);
        iVar3 = 1;
        if (iVar2 == 0) {
          iVar2 = curl_url_set(lVar8,8,pqVar17->q);
          if (iVar2 == 0) {
            iVar4 = curl_url_get(lVar8,0,&url,0);
            if (iVar4 == 0) {
              iVar3 = checkurl(url,pqVar17->out);
              curl_free(url);
              goto LAB_0010476e;
            }
            pcVar14 = "%s:%d Get URL returned %d\n";
            pcVar12 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
            ;
            iVar2 = 0x397;
          }
          else {
            pcVar14 = "Append\nin: %s\nreturned %d (expected %d)\n";
            iVar4 = 0;
          }
          curl_mfprintf(_stderr,pcVar14,pcVar12,iVar2,iVar4);
        }
LAB_0010476e:
        curl_url_cleanup(lVar8);
        pqVar17 = pqVar17 + 1;
      }
      if (iVar3 == 0) {
        ppcVar16 = &set_url_list[0].out;
        iVar2 = 0;
        while ((pcVar12 = ((redircase *)(ppcVar16 + -2))->in, pcVar12 != (char *)0x0 && (iVar2 == 0)
               )) {
          lVar8 = curl_url();
          if (lVar8 == 0) goto LAB_001048f9;
          iVar3 = curl_url_set(lVar8,0,pcVar12);
          iVar2 = 1;
          if (iVar3 == 0) {
            pcVar12 = ppcVar16[-1];
            iVar3 = curl_url_set(lVar8,0,pcVar12);
            if (iVar3 == 0) {
              url = (char *)0x0;
              iVar3 = curl_url_get(lVar8,0,&url,0);
              if (iVar3 == 0) {
                iVar2 = checkurl(url,*ppcVar16);
              }
              else {
                curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                              ,0x2d6,iVar3);
              }
              curl_free(url);
            }
            else {
              curl_mfprintf(_stderr,"%s:%d Set URL %s returned %d\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                            ,0x2cd,pcVar12,iVar3);
            }
          }
          else {
            curl_mfprintf(_stderr,"Set URL\nin: %s\nreturned %d (expected %d)\n",pcVar12,iVar3,0);
          }
          curl_url_cleanup(lVar8);
          ppcVar16 = ppcVar16 + 5;
        }
        if (iVar2 == 0) {
LAB_001048f9:
          lVar8 = 0;
          iVar3 = 0;
          while ((local_1f0 = set_parts_list[lVar8].set, local_1f0 != (char *)0x0 && (iVar3 == 0)))
          {
            lVar9 = curl_url();
            if (lVar9 == 0) {
              return 2;
            }
            pcVar12 = set_parts_list[lVar8].in;
            if ((pcVar12 == (char *)0x0) ||
               (CVar5 = curl_url_set(lVar9,0,pcVar12,set_parts_list[lVar8].urlflags),
               CVar5 == CURLUE_OK)) {
              url_2 = (char *)0x0;
              uVar13 = set_parts_list[lVar8].setflags;
              pcVar12 = local_1f0;
              local_1e8 = set_parts_list + lVar8;
              local_1e0 = lVar8;
              while (pcVar14 = strchr(pcVar12,0x2c), pcVar14 != (char *)0x0) {
                memcpy(&url,pcVar12,(long)pcVar14 - (long)pcVar12);
                *(undefined1 *)((long)&url + ((long)pcVar14 - (long)pcVar12)) = 0;
                iVar2 = __isoc99_sscanf(&url,"%79[^=]=%79[^,]",part,local_88);
                if (iVar2 == 2) {
                  uVar7 = 0;
                  if (part._0_4_ != 0x6c7275) {
                    iVar2 = bcmp("scheme",part,7);
                    uVar7 = 1;
                    if (iVar2 != 0) {
                      iVar2 = bcmp("user",part,5);
                      uVar7 = 2;
                      if (iVar2 != 0) {
                        iVar2 = bcmp("password",part,9);
                        uVar7 = 3;
                        if ((iVar2 != 0) && (uVar7 = 4, part._0_8_ != 0x736e6f6974706f)) {
                          iVar2 = bcmp("host",part,5);
                          uVar7 = 5;
                          if (iVar2 != 0) {
                            iVar2 = bcmp("port",part,5);
                            uVar7 = 6;
                            if (iVar2 != 0) {
                              iVar2 = bcmp("path",part,5);
                              uVar7 = 7;
                              if (iVar2 != 0) {
                                iVar2 = bcmp("query",part,6);
                                uVar7 = 8;
                                if (iVar2 != 0) {
                                  iVar2 = bcmp("fragment",part,9);
                                  uVar7 = 9;
                                  if (iVar2 != 0) {
                                    iVar2 = bcmp("zoneid",part,7);
                                    uVar7 = 10;
                                    if (iVar2 != 0) {
                                      curl_mfprintf(_stderr,"UNKNOWN part \'%s\'\n",part);
                                      uVar7 = 9999;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  iVar2 = bcmp("NULL",local_88,5);
                  if (iVar2 == 0) {
                    pcVar12 = (char *)0x0;
                  }
                  else {
                    iVar2 = bcmp("\"\"",local_88,3);
                    pcVar12 = local_88;
                    if (iVar2 == 0) {
                      pcVar12 = "";
                    }
                  }
                  CVar5 = curl_url_set(lVar9,uVar7,pcVar12,uVar13);
                  if (CVar5 != CURLUE_OK) goto LAB_00104be6;
                }
                pcVar12 = pcVar14 + 1;
              }
              CVar5 = CURLUE_OK;
LAB_00104be6:
              lVar8 = local_1e0;
              psVar1 = local_1e8;
              bVar20 = CVar5 != local_1e8->pcode;
              if (bVar20) {
                curl_mfprintf(_stderr,"updateurl\nin: %s\nreturned %d (expected %d)\n",local_1f0,
                              CVar5);
              }
              uVar13 = (uint)bVar20;
              iVar2 = curl_url_get(lVar9,0,&url_2,0);
              if (iVar2 == 0) {
                iVar3 = checkurl(url_2,psVar1->out);
                iVar3 = uVar13 + iVar3;
              }
              else {
                curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                              ,0x30b,iVar2);
                iVar3 = uVar13 + 1;
              }
              curl_free(url_2);
            }
            else {
              iVar3 = 0;
              if (CVar5 != set_parts_list[lVar8].ucode) {
                curl_mfprintf(_stderr,"Set parts\nin: %s\nreturned %d (expected %d)\n",pcVar12);
                iVar3 = 1;
              }
            }
            curl_url_cleanup(lVar9);
            lVar8 = lVar8 + 1;
          }
          iVar2 = 2;
          if (iVar3 == 0) {
            pCVar18 = &get_url_list[0].ucode;
            iVar2 = 3;
            iVar3 = 0;
            while ((pcVar12 = ((urltestcase *)(pCVar18 + -6))->in, pcVar12 != (char *)0x0 &&
                   (iVar3 == 0))) {
              lVar8 = curl_url();
              if (lVar8 == 0) {
                return 3;
              }
              CVar5 = curl_url_set(lVar8,0,pcVar12,pCVar18[-2]);
              if (CVar5 == CURLUE_OK) {
                url = (char *)0x0;
                iVar3 = curl_url_get(lVar8,0,&url,pCVar18[-1]);
                if (iVar3 == 0) {
                  iVar3 = checkurl(url,*(char **)(pCVar18 + -4));
                }
                else {
                  curl_mfprintf(_stderr,"%s:%d returned %d\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                                ,0x330,iVar3);
                  iVar3 = 1;
                }
                curl_free(url);
              }
              else {
                iVar3 = 0;
                if (CVar5 != *pCVar18) {
                  curl_mfprintf(_stderr,"Get URL\nin: %s\nreturned %d (expected %d)\n",pcVar12,CVar5
                               );
                  iVar3 = 1;
                }
              }
              curl_url_cleanup(lVar8);
              pCVar18 = pCVar18 + 8;
            }
            if (iVar3 == 0) {
              bVar20 = false;
              for (lVar8 = 0;
                  (iVar2 = 4, !bVar20 &&
                  (pcVar12 = get_parts_list[lVar8].in, pcVar12 != (char *)0x0)); lVar8 = lVar8 + 1)
              {
                lVar9 = curl_url();
                if (lVar9 == 0) {
                  return 4;
                }
                CVar5 = get_parts_list[lVar8].ucode;
                CVar6 = curl_url_set(lVar9,0,pcVar12,get_parts_list[lVar8].urlflags);
                if (CVar6 == CVar5) {
                  if (CVar6 == CURLUE_OK) {
                    pcVar14 = get_parts_list[lVar8].out;
                    uVar13 = get_parts_list[lVar8].getflags;
                    url = (char *)((ulong)url & 0xffffffffffffff00);
                    lVar15 = 0x100;
                    ppcVar16 = &url;
                    for (lVar19 = 0; lVar19 != 0x90; lVar19 = lVar19 + 0x10) {
                      part[0] = '\0';
                      part[1] = '\0';
                      part[2] = '\0';
                      part[3] = '\0';
                      part[4] = '\0';
                      part[5] = '\0';
                      part[6] = '\0';
                      part[7] = '\0';
                      iVar2 = curl_url_get(lVar9,*(undefined4 *)((long)&DAT_0010ad00 + lVar19),part,
                                           uVar13);
                      pcVar11 = " | ";
                      if ((char)url == '\0') {
                        pcVar11 = "";
                      }
                      if (part._0_8_ == 0 || iVar2 != 0) {
                        curl_msnprintf(ppcVar16,lVar15,"%s[%d]",pcVar11,iVar2);
                      }
                      else {
                        curl_msnprintf(ppcVar16,lVar15,"%s%s",pcVar11);
                      }
                      sVar10 = strlen((char *)ppcVar16);
                      ppcVar16 = (char **)((long)ppcVar16 + sVar10);
                      lVar15 = lVar15 - sVar10;
                      curl_free(part._0_8_);
                    }
                    iVar2 = strcmp((char *)&url,pcVar14);
                    if (iVar2 != 0) {
                      curl_mfprintf(_stderr,"in: %s\nwanted: %s\ngot:    %s\n",pcVar12,pcVar14,&url)
                      ;
                      bVar20 = true;
                      goto LAB_00104e42;
                    }
                  }
                  bVar20 = false;
                }
                else {
                  curl_mfprintf(_stderr,"Get parts\nin: %s\nreturned %d (expected %d)\n",pcVar12,
                                CVar6,CVar5);
                  bVar20 = true;
                }
LAB_00104e42:
                curl_url_cleanup(lVar9);
              }
              if (!bVar20) {
                iVar2 = 0;
                curl_mprintf("success\n");
              }
            }
          }
        }
        else {
          iVar2 = 1;
        }
      }
    }
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x417,iVar3);
    curl_url_cleanup(uVar7);
  }
  return iVar2;
}

Assistant:

static int scopeid(void)
{
  CURLU *u = curl_url();
  int error = 0;
  CURLUcode rc;
  char *url;

  rc = curl_url_set(u, CURLUPART_URL,
                    "https://[fe80::20c:29ff:fe9c:409b%25eth0]/hello.html", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_HOST, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST, "[::1]", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST, "example.com", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST,
                    "[fe80::20c:29ff:fe9c:409b%25eth0]", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_get(u, CURLUPART_HOST, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_get(u, CURLUPART_ZONEID, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_ZONEID returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_ZONEID, "clown", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_ZONEID returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  curl_url_cleanup(u);

  return error;
}